

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *mat,
            scalar_sum_op<float,_float> *func)

{
  Index IVar1;
  DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *m;
  CoeffReturnType pfVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  float afVar3 [4];
  long local_e0;
  Index index_3;
  Index index_2;
  Index index_1;
  float local_b8 [4];
  float local_a8 [4];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  float local_5c;
  long lStack_58;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  undefined8 uStack_28;
  int packetAlignment;
  Index packetSize;
  Index size;
  scalar_sum_op<float,_float> *func_local;
  redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *mat_local;
  
  size = (Index)func;
  func_local = (scalar_sum_op<float,_float> *)mat;
  packetSize = redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::size(mat);
  uStack_28 = 4;
  alignedStart._4_4_ = 0x10;
  m = (DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
      redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::nestedExpression
                ((redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)func_local);
  alignedSize2 = first_default_aligned<Eigen::Matrix<float,_1,_1,0,_1,_1>>(m);
  alignedSize = ((packetSize - alignedSize2) / 8) * 8;
  alignedEnd2 = ((packetSize - alignedSize2) / 4) * 4;
  alignedEnd = alignedSize2 + alignedSize;
  lStack_58 = alignedSize2 + alignedEnd2;
  if (alignedEnd2 == 0) {
    pfVar2 = redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeff
                       ((redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)func_local,0);
    local_5c = *pfVar2;
    for (local_e0 = 1; IVar1 = size, local_e0 < packetSize; local_e0 = local_e0 + 1) {
      pfVar2 = redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeff
                         ((redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)func_local,
                          local_e0);
      local_5c = scalar_sum_op<float,_float>::operator()
                           ((scalar_sum_op<float,_float> *)IVar1,&local_5c,pfVar2);
    }
  }
  else {
    afVar3 = redux_evaluator<Eigen::Matrix<float,-1,-1,0,-1,-1>>::packet<16,float__vector(4)>
                       ((redux_evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)func_local,
                        alignedSize2);
    unique0x100000bc = extraout_XMM0_Dc;
    packet_res1._8_8_ = afVar3._0_8_;
    unique0x100000c0 = extraout_XMM0_Dd;
    if (4 < alignedEnd2) {
      afVar3 = redux_evaluator<Eigen::Matrix<float,-1,-1,0,-1,-1>>::packet<16,float__vector(4)>
                         ((redux_evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)func_local,
                          alignedSize2 + 4);
      unique0x100000e0 = (float)extraout_XMM0_Dc_00;
      index._0_4_ = (float)(int)afVar3._0_8_;
      index._4_4_ = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
      unique0x100000e4 = extraout_XMM0_Dd_00;
      local_90 = alignedSize2;
      while (IVar1 = size, local_90 = local_90 + 8, local_90 < alignedEnd) {
        afVar3 = redux_evaluator<Eigen::Matrix<float,-1,-1,0,-1,-1>>::packet<16,float__vector(4)>
                           ((redux_evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)func_local,
                            local_90);
        local_a8[2] = (float)extraout_XMM0_Dc_01;
        local_a8[0] = (float)(int)afVar3._0_8_;
        local_a8[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        local_a8[3] = extraout_XMM0_Dd_01;
        afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                           ((scalar_sum_op<float,float> *)IVar1,(float (*) [4])(packet_res1 + 2),
                            &local_a8);
        IVar1 = size;
        unique0x10000128 = extraout_XMM0_Dc_02;
        packet_res1._8_8_ = afVar3._0_8_;
        unique0x1000012c = extraout_XMM0_Dd_02;
        afVar3 = redux_evaluator<Eigen::Matrix<float,-1,-1,0,-1,-1>>::packet<16,float__vector(4)>
                           ((redux_evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)func_local,
                            local_90 + 4);
        local_b8[2] = (float)extraout_XMM0_Dc_03;
        local_b8[0] = (float)(int)afVar3._0_8_;
        local_b8[1] = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        local_b8[3] = extraout_XMM0_Dd_03;
        afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                           ((scalar_sum_op<float,float> *)IVar1,(float (*) [4])&index,&local_b8);
        unique0x10000170 = (float)extraout_XMM0_Dc_04;
        index._0_4_ = (float)(int)afVar3._0_8_;
        index._4_4_ = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        unique0x10000174 = extraout_XMM0_Dd_04;
      }
      afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                         ((scalar_sum_op<float,float> *)size,(float (*) [4])(packet_res1 + 2),
                          (float (*) [4])&index);
      IVar1 = size;
      unique0x10000194 = extraout_XMM0_Dc_05;
      packet_res1._8_8_ = afVar3._0_8_;
      unique0x10000198 = extraout_XMM0_Dd_05;
      if (alignedEnd < lStack_58) {
        afVar3 = redux_evaluator<Eigen::Matrix<float,-1,-1,0,-1,-1>>::packet<16,float__vector(4)>
                           ((redux_evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)func_local,
                            alignedEnd);
        unique0x100001b8 = (float)extraout_XMM0_Dc_06;
        index_1._0_4_ = (float)(int)afVar3._0_8_;
        index_1._4_4_ = (float)(int)((ulong)afVar3._0_8_ >> 0x20);
        unique0x100001bc = extraout_XMM0_Dd_06;
        afVar3 = scalar_sum_op<float,float>::packetOp<float__vector(4)>
                           ((scalar_sum_op<float,float> *)IVar1,(float (*) [4])(packet_res1 + 2),
                            (float (*) [4])&index_1);
        unique0x100001dc = extraout_XMM0_Dc_07;
        packet_res1._8_8_ = afVar3._0_8_;
        unique0x100001e0 = extraout_XMM0_Dd_07;
      }
    }
    local_5c = scalar_sum_op<float,float>::predux<float__vector(4)>
                         ((scalar_sum_op<float,float> *)size,(float (*) [4])(packet_res1 + 2));
    for (index_2 = 0; IVar1 = size, index_2 < alignedSize2; index_2 = index_2 + 1) {
      pfVar2 = redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeff
                         ((redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)func_local,
                          index_2);
      local_5c = scalar_sum_op<float,_float>::operator()
                           ((scalar_sum_op<float,_float> *)IVar1,&local_5c,pfVar2);
    }
    for (index_3 = lStack_58; IVar1 = size, index_3 < packetSize; index_3 = index_3 + 1) {
      pfVar2 = redux_evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeff
                         ((redux_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)func_local,
                          index_3);
      local_5c = scalar_sum_op<float,_float>::operator()
                           ((scalar_sum_op<float,_float> *)IVar1,&local_5c,pfVar2);
    }
  }
  return local_5c;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }